

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::giveFocusAccordingToFocusPolicy
               (QWidget *widget,QEvent *event,QPoint localPos)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  FocusPolicy policy;
  uint uVar4;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *f;
  QWidget *focusWidget;
  FocusPolicy focusPolicy;
  bool setFocusOnRelease;
  QWidget *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffa8;
  QWidget *local_50;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  undefined1 local_28 [4];
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::styleHints();
  uVar1 = QStyleHints::setFocusOnTouchRelease();
  uVar6 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffbc) & 0x1ffffff;
  uVar5 = 2;
  if ((giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::focusedWidgetOnTouchBegin == '\0')
     && (iVar3 = __cxa_guard_acquire(&giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::
                                      focusedWidgetOnTouchBegin), iVar3 != 0)) {
    __cxa_atexit(QPointer<QWidget>::~QPointer,
                 &giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin,&__dso_handle);
    __cxa_guard_release(&giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::
                         focusedWidgetOnTouchBegin);
  }
  policy = QEvent::type(in_RSI);
  local_50 = in_RDI;
  if (policy == ClickFocus) {
LAB_002d3cc2:
    QApplication::focusWidget();
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(policy,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    if ((uVar6 & 0x1000000) != 0) goto LAB_002d3e85;
  }
  else {
    if (policy != (ClickFocus|TabFocus)) {
      if (policy != 4) {
        if (policy == 0x1f) {
          uVar5 = 0xf;
          goto LAB_002d3d31;
        }
        if (policy != 0xc2) {
          if (policy != 0xc4) goto LAB_002d3e85;
          goto LAB_002d3ce4;
        }
      }
      goto LAB_002d3cc2;
    }
LAB_002d3ce4:
    if ((uVar6 & 0x1000000) == 0) goto LAB_002d3e85;
    QApplication::focusWidget();
    bVar2 = ::operator!=((QPointer<QWidget> *)CONCAT44(policy,in_stack_ffffffffffffffa0),
                         (QWidget **)in_stack_ffffffffffffff98);
    if (bVar2) goto LAB_002d3e85;
  }
LAB_002d3d31:
  while (local_50 != (QWidget *)0x0) {
    bVar2 = QWidget::isEnabled((QWidget *)0x2d3d47);
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 & 0xffffff;
    if (bVar2) {
      _local_28 = QWidget::rect((QWidget *)CONCAT44(uVar6,uVar5));
      uVar4 = QRect::contains((QPoint *)local_28,SUB81(local_10,0));
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 & 0xffffff;
      if ((uVar4 & 1) != 0) {
        bVar2 = shouldSetFocus(in_stack_ffffffffffffffa8,policy);
        in_stack_ffffffffffffffa0 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffa0);
      }
    }
    if ((char)(in_stack_ffffffffffffffa0 >> 0x18) != '\0') {
      QWidget::setFocus(local_28._8_8_,local_28._4_4_);
      break;
    }
    bVar2 = QWidget::isWindow((QWidget *)CONCAT44(policy,in_stack_ffffffffffffffa0));
    if (bVar2) break;
    QWidget::d_func((QWidget *)0x2d3de0);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d3dec);
    in_stack_ffffffffffffffa8 = local_50;
    if (bVar2) {
      QWidget::d_func((QWidget *)0x2d3dfc);
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d3e08);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d3e14);
      in_stack_ffffffffffffffa8 = local_50;
      if (bVar2) {
        QWidget::d_func((QWidget *)0x2d3e24);
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d3e30);
        in_stack_ffffffffffffffa8 =
             ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d3e3c);
      }
    }
    bVar2 = QWidget::hasFocus((QWidget *)CONCAT44(uVar6,uVar5));
    if (bVar2) break;
    QWidget::pos(in_stack_ffffffffffffffa8);
    QPoint::operator+=((QPoint *)CONCAT44(policy,in_stack_ffffffffffffffa0),
                       (QPoint *)in_stack_ffffffffffffff98);
    local_50 = QWidget::parentWidget((QWidget *)0x2d3e7b);
  }
LAB_002d3e85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::giveFocusAccordingToFocusPolicy(QWidget *widget, QEvent *event, QPoint localPos)
{
    const bool setFocusOnRelease = QGuiApplication::styleHints()->setFocusOnTouchRelease();
    Qt::FocusPolicy focusPolicy = Qt::ClickFocus;
    static QPointer<QWidget> focusedWidgetOnTouchBegin = nullptr;

    switch (event->type()) {
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonDblClick:
        case QEvent::TouchBegin:
            focusedWidgetOnTouchBegin = QApplication::focusWidget();
            if (setFocusOnRelease)
                return;
            break;
        case QEvent::MouseButtonRelease:
        case QEvent::TouchEnd:
            if (!setFocusOnRelease)
                return;
            if (focusedWidgetOnTouchBegin != QApplication::focusWidget()) {
                // Focus widget was changed while delivering press/move events.
                // To not interfere with application logic, we leave focus as-is
                return;
            }
            break;
        case QEvent::Wheel:
            focusPolicy = Qt::WheelFocus;
            break;
        default:
            return;
    }

    QWidget *focusWidget = widget;
    while (focusWidget) {
        if (focusWidget->isEnabled()
            && focusWidget->rect().contains(localPos)
            && QApplicationPrivate::shouldSetFocus(focusWidget, focusPolicy)) {
            focusWidget->setFocus(Qt::MouseFocusReason);
            break;
        }
        if (focusWidget->isWindow())
            break;

        // find out whether this widget (or its proxy) already has focus
        QWidget *f = focusWidget;
        if (focusWidget->d_func()->extra && focusWidget->d_func()->extra->focus_proxy)
            f = focusWidget->d_func()->extra->focus_proxy;
        // if it has, stop here.
        // otherwise a click on the focused widget would remove its focus if ClickFocus isn't set
        if (f->hasFocus())
            break;

        localPos += focusWidget->pos();
        focusWidget = focusWidget->parentWidget();
    }
}